

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O2

string * __thiscall
flow::diagnostics::Message::string_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  
  if (this->type == LinkError) {
    format_str_00.size_ = (size_t)this;
    format_str_00.data_ = (char *)0x6;
    fmt::v5::format<flow::diagnostics::Type,std::__cxx11::string>
              (__return_storage_ptr__,(v5 *)0x15c819,format_str_00,(Type *)&this->text,in_R9);
  }
  else if (this->type == Warning) {
    format_str.size_ = (size_t)&this->sourceLocation;
    format_str.data_ = (char *)0x7;
    fmt::v5::format<flow::SourceLocation,std::__cxx11::string>
              (__return_storage_ptr__,(v5 *)"[{}] {}",format_str,(SourceLocation *)&this->text,in_R9
              );
  }
  else {
    format_str_01.size_ = (size_t)&this->sourceLocation;
    format_str_01.data_ = (char *)0xb;
    fmt::v5::format<flow::SourceLocation,flow::diagnostics::Type,std::__cxx11::string>
              (__return_storage_ptr__,(v5 *)"[{}] {}: {}",format_str_01,(SourceLocation *)this,
               (Type *)&this->text,unaff_RBX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Message::string() const {
  switch (type) {
    case Type::Warning:
      return fmt::format("[{}] {}", sourceLocation, text);
    case Type::LinkError:
      return fmt::format("{}: {}", type, text);
    default:
      return fmt::format("[{}] {}: {}", sourceLocation, type, text);
  }
}